

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_linux_alsa.c
# Opt level: O1

int SetApproximateSampleRate(snd_pcm_t *pcm,snd_pcm_hw_params_t *hwParams,double sampleRate)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int _dir;
  uint _max;
  uint _min;
  uint setRate;
  int local_48;
  undefined4 local_40;
  undefined4 local_3c;
  undefined4 local_38;
  uint local_34;
  
  if ((pcm != (snd_pcm_t *)0x0) && (hwParams != (snd_pcm_hw_params_t *)0x0)) {
    uVar4 = (uint)(long)sampleRate;
    local_48 = 0;
    local_34 = uVar4;
    iVar2 = snd_pcm_hw_params_set_rate_near(pcm,hwParams,&local_34,0);
    if (iVar2 < 0) {
      SetApproximateSampleRate_cold_1();
      do {
        local_38 = 0;
        local_3c = 0;
        local_40 = 0;
        iVar2 = snd_pcm_hw_params_get_rate_min(hwParams,&local_38,&local_40);
        if (iVar2 < 0) {
          SetApproximateSampleRate_cold_2();
          bVar1 = true;
        }
        else {
          iVar2 = snd_pcm_hw_params_get_rate_max(hwParams,&local_3c,&local_40);
          bVar1 = false;
          if (iVar2 < 0) {
            SetApproximateSampleRate_cold_3();
            bVar1 = true;
          }
        }
        local_48 = -9999;
      } while (bVar1);
    }
    else {
      iVar2 = local_34 - uVar4;
      if (iVar2 != 0) {
        iVar3 = -iVar2;
        if (0 < iVar2) {
          iVar3 = iVar2;
        }
        if (uVar4 < (uint)(iVar3 * 100)) {
          local_48 = -0x270d;
        }
      }
    }
    return local_48;
  }
  __assert_fail("pcm && hwParams",
                "/workspace/llm4binary/github/license_all_cmakelists_25/syb0rg[P]PortAudio2/src/hostapi/alsa/pa_linux_alsa.c"
                ,0xc77,"int SetApproximateSampleRate(snd_pcm_t *, snd_pcm_hw_params_t *, double)");
}

Assistant:

static int SetApproximateSampleRate( snd_pcm_t *pcm, snd_pcm_hw_params_t *hwParams, double sampleRate )
{
    PaError result = paNoError;
    unsigned int reqRate, setRate, deviation;

    assert( pcm && hwParams );

    /* The Alsa sample rate is set by integer value; also the actual rate may differ */
    reqRate = setRate = (unsigned int) sampleRate;

    ENSURE_( alsa_snd_pcm_hw_params_set_rate_near( pcm, hwParams, &setRate, NULL ), paUnanticipatedHostError );
    /* The value actually set will be put in 'setRate' (may be way off); check the deviation as a proportion
     * of the requested-rate with reference to the max-deviate-ratio (larger values allow less deviation) */
    deviation = abs( setRate - reqRate );
    if( deviation > 0 && deviation * RATE_MAX_DEVIATE_RATIO > reqRate )
        result = paInvalidSampleRate;

end:
    return result;

error:
    /* Log */
    {
        unsigned int _min = 0, _max = 0;
        int _dir = 0;
        ENSURE_( alsa_snd_pcm_hw_params_get_rate_min( hwParams, &_min, &_dir ), paUnanticipatedHostError );
        ENSURE_( alsa_snd_pcm_hw_params_get_rate_max( hwParams, &_max, &_dir ), paUnanticipatedHostError );
        PA_DEBUG(( "%s: SR min = %u, max = %u, req = %u\n", __FUNCTION__, _min, _max, reqRate ));
    }
    goto end;
}